

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cc
# Opt level: O0

EventLoop * __thiscall tt::net::EventLoopThread::startLoop(EventLoopThread *this)

{
  bool bVar1;
  MutexLock *mutex;
  MutexLockGuard local_18;
  MutexLockGuard lock;
  EventLoopThread *this_local;
  
  lock.m_mutex = (MutexLock *)this;
  bVar1 = Thread::started(&this->m_thread);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_thread.started()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/EventLoopThread.cc"
                  ,0x1f,"EventLoop *tt::net::EventLoopThread::startLoop()");
  }
  Thread::start(&this->m_thread);
  mutex = &this->m_mutex;
  MutexLockGuard::MutexLockGuard(&local_18,mutex);
  while (this->m_loop == (EventLoop *)0x0) {
    Condition::wait(&this->m_cond,mutex);
  }
  MutexLockGuard::~MutexLockGuard(&local_18);
  return this->m_loop;
}

Assistant:

EventLoop* EventLoopThread::startLoop(){

	assert(!m_thread.started());
	m_thread.start();

	{
		MutexLockGuard lock(m_mutex);

		//一直等到 htreadFun 在Thread 里真正跑起来
		
		while(m_loop == NULL) m_cond.wait();
	}

	return m_loop;
}